

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.h
# Opt level: O1

void __thiscall CheaterBotStrategy::CheaterBotStrategy(CheaterBotStrategy *this,Player *player)

{
  string *psVar1;
  
  PlayerStrategy::PlayerStrategy(&this->super_PlayerStrategy,player);
  (this->super_PlayerStrategy)._vptr_PlayerStrategy = (_func_int **)&PTR_yesOrNo_0013ea58;
  psVar1 = (string *)operator_new(0x20);
  (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar1,"CHEATER","");
  (this->super_PlayerStrategy).strategyName = psVar1;
  return;
}

Assistant:

~CheaterBotStrategy() = default;